

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

void __thiscall rcg::Buffer::setHandle(Buffer *this,void *handle)

{
  bool bVar1;
  unsigned_long uVar2;
  element_type *buffer;
  void *stream;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_stack_ffffffffffffffb8;
  BUFFER_INFO_CMD BVar3;
  void *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffffd0;
  shared_ptr<const_rcg::GenTLWrapper> *gentl;
  
  BVar3 = (BUFFER_INFO_CMD)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  in_RDI[3] = in_RSI;
  in_RDI[4] = 0;
  *(undefined1 *)(in_RDI + 5) = 0;
  if (in_RDI[3] == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 8));
    if (bVar1) {
      std::__shared_ptr_access<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x12b162);
      GenApi_3_4::CChunkAdapter::DetachBuffer();
    }
  }
  else {
    Stream::getHandle((Stream *)*in_RDI);
    uVar2 = anon_unknown_5::getBufferValue<unsigned_long>
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
                       ,BVar3);
    in_RDI[4] = uVar2;
    Stream::getHandle((Stream *)*in_RDI);
    uVar2 = anon_unknown_5::getBufferValue<unsigned_long>
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
                       ,BVar3);
    *(bool *)(in_RDI + 5) = uVar2 == 10;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 8));
    if (bVar1) {
      gentl = (shared_ptr<const_rcg::GenTLWrapper> *)(in_RDI + 1);
      Stream::getHandle((Stream *)*in_RDI);
      bVar1 = anon_unknown_5::getBufferBool
                        (gentl,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,BVar3);
      if (!bVar1) {
        buffer = std::
                 __shared_ptr_access<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x12b0b4);
        Stream::getHandle((Stream *)*in_RDI);
        stream = (anonymous_namespace)::getBufferValue<void*>
                           (gentl,in_stack_ffffffffffffffc8,buffer,BVar3);
        BVar3 = (BUFFER_INFO_CMD)((ulong)(in_RDI + 1) >> 0x20);
        Stream::getHandle((Stream *)*in_RDI);
        uVar2 = anon_unknown_5::getBufferValue<unsigned_long>(gentl,stream,buffer,BVar3);
        (**(code **)(*(long *)buffer + 0x18))(buffer,stream,uVar2,0);
      }
    }
  }
  return;
}

Assistant:

void Buffer::setHandle(void *handle)
{
  buffer=handle;

  payload_type=PAYLOAD_TYPE_UNKNOWN;
  multipart=false;

  if (buffer != 0)
  {
    payload_type=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                        GenTL::BUFFER_INFO_PAYLOADTYPE);

    multipart=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                     GenTL::BUFFER_INFO_PAYLOADTYPE) == PAYLOAD_TYPE_MULTI_PART;

    if (chunkadapter && !getBufferBool(gentl, parent->getHandle(), buffer,
      GenTL::BUFFER_INFO_IS_INCOMPLETE))
    {
      chunkadapter->AttachBuffer(reinterpret_cast<uint8_t *>(
        getBufferValue<void *>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_BASE)),
        static_cast<int64_t>(getBufferValue<size_t>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_SIZE_FILLED)));
    }
  }
  else
  {
    if (chunkadapter)
    {
      chunkadapter->DetachBuffer();
    }
  }
}